

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O0

void __thiscall
QPainter::drawImage(QPainter *this,int x,int y,QImage *image,int sx,int sy,int sw,int sh,
                   ImageConversionFlags flags)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  ImageConversionFlag in_EDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  QRectF *in_stack_00000048;
  QImage *in_stack_00000050;
  QRectF *in_stack_00000058;
  QPainter *in_stack_00000060;
  ImageConversionFlags in_stack_0000016c;
  QRectF local_60;
  QImage *in_stack_ffffffffffffffc0;
  QPointF *in_stack_ffffffffffffffc8;
  QPainter *in_stack_ffffffffffffffd0;
  QPointF local_20;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = image._0_4_;
  if ((((in_R8D == 0) && (in_R9D == 0)) && (in_stack_00000008 == -1)) && (sy == -1)) {
    local_10 = image._0_4_;
    bVar1 = ::operator==((QFlags<Qt::ImageConversionFlag>)0x0,in_EDI);
    if (bVar1) {
      QPointF::QPointF(&local_20,(double)in_ESI,(double)in_EDX);
      drawImage(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      goto LAB_0055a1ea;
    }
  }
  QRectF::QRectF((QRectF *)&stack0xffffffffffffffc0,(double)in_ESI,(double)in_EDX,-1.0,-1.0);
  QRectF::QRectF(&local_60,(double)in_R8D,(double)in_R9D,(double)in_stack_00000008,(double)sy);
  drawImage(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
            in_stack_0000016c);
LAB_0055a1ea:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QPainter::drawImage(int x, int y, const QImage &image, int sx, int sy, int sw, int sh,
                                Qt::ImageConversionFlags flags)
{
    if (sx == 0 && sy == 0 && sw == -1 && sh == -1 && flags == Qt::AutoColor)
        drawImage(QPointF(x, y), image);
    else
        drawImage(QRectF(x, y, -1, -1), image, QRectF(sx, sy, sw, sh), flags);
}